

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_MNDX.cpp
# Opt level: O0

DWORD __thiscall
TFileNameDatabase::GetPathFragmentOffset2
          (TFileNameDatabase *this,DWORD *index_hibits,DWORD index_lobits)

{
  DWORD DVar1;
  byte *pbVar2;
  DWORD index_lobits_local;
  DWORD *index_hibits_local;
  TFileNameDatabase *this_local;
  
  if (*index_hibits == 0xffffffff) {
    DVar1 = TSparseArray::GetItemValueAt(&this->CollisionHiBitsIndexes,(ulong)index_lobits);
    *index_hibits = DVar1;
  }
  else {
    *index_hibits = *index_hibits + 1;
  }
  DVar1 = TBitEntryArray::GetItem(&this->HiBitsTable,*index_hibits);
  pbVar2 = TGenericArray<unsigned_char>::operator[](&this->LoBitsTable,(ulong)index_lobits);
  return DVar1 << 8 | (uint)*pbVar2;
}

Assistant:

DWORD GetPathFragmentOffset2(DWORD & index_hibits, DWORD index_lobits)
    {
        // If the hi-bits index is invalid, we need to get its starting value
        if (index_hibits == CASC_INVALID_INDEX)
        {
/*
            printf("\n");
            for (DWORD i = 0; i < CollisionHiBitsIndexes.TotalItemCount; i++)
            {
                if (CollisionHiBitsIndexes.IsItemPresent(i))
                    printf("[%02X] = %02X\n", i, CollisionHiBitsIndexes.GetIntValueAt(i));
                else
                    printf("[%02X] = NOT_PRESENT\n", i);
            }
*/
            index_hibits = CollisionHiBitsIndexes.GetItemValueAt(index_lobits);
        }
        else
        {
            index_hibits++;
        }

        // Now we use both NodeIndex and HiBits index for retrieving the path fragment index
        return (HiBitsTable.GetItem(index_hibits) << 0x08) | LoBitsTable[index_lobits];
    }